

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O3

Image * rw::gl3::rasterToImage(Raster *raster)

{
  uint8 *puVar1;
  int iVar2;
  Image *this;
  uint uVar3;
  int32 depth;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint8 *puVar8;
  uint8 *puVar9;
  code *pcVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  
  puVar1 = raster->pixels;
  if (puVar1 == (uint8 *)0x0) {
    Raster::lock(raster,0,2);
  }
  lVar6 = (long)nativeRasterOffset;
  if (*(char *)((long)&raster->width + lVar6) == '\x01') {
    rasterToImage();
  }
  else {
    uVar3 = (raster->format & 0xf00U) - 0x100 >> 8;
    if (uVar3 == 0) {
      depth = 0x10;
      pcVar10 = conv_ARGB1555_from_RGBA5551;
    }
    else if (uVar3 == 5) {
      depth = 0x18;
      pcVar10 = conv_RGB888_from_RGB888;
    }
    else {
      if (uVar3 != 4) {
        rasterToImage();
        return (Image *)0x0;
      }
      depth = 0x20;
      pcVar10 = conv_RGBA8888_from_RGBA8888;
    }
    if ((raster->format & 0x6000U) == 0) {
      this = Image::create(raster->width,raster->height,depth);
      Image::allocate(this);
      iVar5 = this->height;
      if (0 < iVar5) {
        puVar12 = raster->pixels;
        iVar2 = this->width;
        iVar4 = this->stride;
        puVar8 = this->pixels + (iVar5 + -1) * iVar4;
        iVar7 = 0;
        do {
          if (0 < iVar2) {
            iVar5 = 0;
            puVar9 = puVar8;
            puVar11 = puVar12;
            do {
              (*pcVar10)(puVar9,puVar11);
              puVar9 = puVar9 + this->bpp;
              puVar11 = puVar11 + *(int *)((long)&raster->privateFlags + lVar6);
              iVar5 = iVar5 + 1;
              iVar2 = this->width;
            } while (iVar5 < iVar2);
            iVar5 = this->height;
            iVar4 = this->stride;
          }
          puVar8 = puVar8 + -(long)iVar4;
          puVar12 = puVar12 + raster->stride;
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar5);
      }
      if (puVar1 == (uint8 *)0x0) {
        Raster::unlock(raster,0);
        return this;
      }
      return this;
    }
    rasterToImage();
  }
  return (Image *)0x0;
}

Assistant:

Image*
rasterToImage(Raster *raster)
{
	int32 depth;
	Image *image;

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKREAD);
		unlock = true;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	if(natras->isCompressed){
		// TODO
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	void (*conv)(uint8 *out, uint8 *in) = nil;
	switch(raster->format & 0xF00){
	case Raster::C1555:
		depth = 16;
		conv = conv_ARGB1555_from_RGBA5551;
		break;
	case Raster::C8888:
		depth = 32;
		conv = conv_RGBA8888_from_RGBA8888;
		break;
	case Raster::C888:
		depth = 24;
		conv = conv_RGB888_from_RGB888;
		break;

	default:
	case Raster::C555:
	case Raster::C565:
	case Raster::C4444:
	case Raster::LUM8:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

	if(raster->format & Raster::PAL4 ||
	   raster->format & Raster::PAL8){
		RWERROR((ERR_INVRASTER));
		return nil;
	}
		
	uint8 *in, *out;
	image = Image::create(raster->width, raster->height, depth);
	image->allocate();

	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;
	uint8 *pixels = raster->pixels;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(imgrow, rasrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}

	if(unlock)
		raster->unlock(0);

	return image;
}